

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Vec_Int_t * Wla_ManCollectNodes(Wla_Man_t *pWla,int fBlack)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int local_24;
  int Entry;
  int i;
  Vec_Int_t *vNodes;
  int fBlack_local;
  Wla_Man_t *pWla_local;
  
  if (pWla->vSignals == (Vec_Int_t *)0x0) {
    __assert_fail("pWla->vSignals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                  ,0x537,"Vec_Int_t *Wla_ManCollectNodes(Wla_Man_t *, int)");
  }
  p = Vec_IntAlloc(100);
  for (local_24 = 0; iVar1 = Vec_IntSize(pWla->vSignals), local_24 < iVar1; local_24 = local_24 + 1)
  {
    iVar1 = Vec_IntEntry(pWla->vSignals,local_24);
    if ((fBlack == 0) && (iVar2 = Vec_BitEntry(pWla->vUnmark,iVar1), iVar2 != 0)) {
      Vec_IntPush(p,iVar1);
    }
    if ((fBlack != 0) && (iVar2 = Vec_BitEntry(pWla->vUnmark,iVar1), iVar2 == 0)) {
      Vec_IntPush(p,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Wla_ManCollectNodes( Wla_Man_t * pWla, int fBlack )
{
    Vec_Int_t * vNodes = NULL;
    int i, Entry;

    assert( pWla->vSignals );

    vNodes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( pWla->vSignals, Entry, i )
    {
        if ( !fBlack && Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
        
        if ( fBlack && !Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
    }

    return vNodes;
}